

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_adaptive.cpp
# Opt level: O0

void __thiscall
so_5::impl::adaptive_subscr_storage::storage_t::setup_content
          (storage_t *this,subscr_info_vector_t *info)

{
  size_type sVar1;
  pointer local_30;
  pointer s;
  subscr_info_vector_t *info_local;
  storage_t *this_local;
  
  sVar1 = std::
          vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
          ::size(info);
  if (this->m_threshold < sVar1) {
    local_30 = std::
               unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
               ::get(&this->m_large_storage);
  }
  else {
    local_30 = std::
               unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
               ::get(&this->m_small_storage);
  }
  (*local_30->_vptr_subscription_storage_t[9])(local_30,info);
  this->m_current_storage = local_30;
  return;
}

Assistant:

void
storage_t::setup_content(
	subscription_storage_common::subscr_info_vector_t && info )
	{
		auto s = info.size() <= m_threshold ?
				m_small_storage.get() : m_large_storage.get();

		s->setup_content( std::move( info ) );

		m_current_storage = s;
	}